

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockencodings_tests.cpp
# Opt level: O2

void __thiscall
blockencodings_tests::TransactionsRequestSerializationTest::test_method
          (TransactionsRequestSerializationTest *this)

{
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  string *psVar2;
  pointer puVar3;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  undefined **local_158;
  undefined1 local_150;
  undefined1 *local_148;
  char *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  _Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> local_118;
  undefined8 uStack_100;
  string local_f8;
  string local_d8;
  BlockTransactionsRequest req2;
  uint256 local_78;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_78.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  RandomMixin<FastRandomContext>::rand256
            (&local_78,
             &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
              super_BasicTestingSetup.m_rng.super_RandomMixin<FastRandomContext>);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_58,4);
  local_58._M_impl.super__Vector_impl_data._M_start[0] = 0;
  local_58._M_impl.super__Vector_impl_data._M_start[1] = 1;
  local_58._M_impl.super__Vector_impl_data._M_start[2] = 3;
  local_58._M_impl.super__Vector_impl_data._M_start[3] = 4;
  local_118._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_100 = 0;
  local_118._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  BlockTransactionsRequest::
  SerializationOps<DataStream,BlockTransactionsRequest_const,ActionSerialize>();
  req2.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  req2.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  req2.blockhash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  req2.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BlockTransactionsRequest::SerializationOps<DataStream,BlockTransactionsRequest,ActionUnserialize>
            (&req2,&local_118);
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x174;
  file.m_begin = (iterator)&local_128;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_138,msg);
  local_150 = 0;
  local_158 = &PTR__lazy_ostream_01139f30;
  local_148 = boost::unit_test::lazy_ostream::inst;
  local_140 = "";
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_160 = "";
  base_blob<256u>::ToString_abi_cxx11_(&local_d8,(base_blob<256u> *)&local_78);
  base_blob<256u>::ToString_abi_cxx11_(&local_f8,(base_blob<256u> *)&req2);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_d8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_158,&local_168,0x174,1,2,psVar2,"req1.blockhash.ToString()",&local_f8,
             "req2.blockhash.ToString()");
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  local_178 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)psVar2;
  msg_00.m_begin = pvVar1;
  file_00.m_end = (iterator)0x175;
  file_00.m_begin = (iterator)&local_178;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_188,
             msg_00);
  local_150 = 0;
  local_158 = &PTR__lazy_ostream_01139f30;
  local_148 = boost::unit_test::lazy_ostream::inst;
  local_140 = "";
  local_198 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_190 = "";
  local_d8._M_dataplus._M_p =
       (pointer)((long)local_58._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_58._M_impl.super__Vector_impl_data._M_start >> 1);
  psVar2 = &local_d8;
  local_f8._M_dataplus._M_p =
       (pointer)((long)req2.indexes.
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)req2.indexes.
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_start >> 1);
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_158,&local_198,0x175,1,2,psVar2,"req1.indexes.size()",&local_f8,
             "req2.indexes.size()");
  local_1a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_1a0 = "";
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)psVar2;
  msg_01.m_begin = pvVar1;
  file_01.m_end = (iterator)0x176;
  file_01.m_begin = (iterator)&local_1a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1b8,
             msg_01);
  local_150 = 0;
  local_158 = &PTR__lazy_ostream_01139f30;
  local_148 = boost::unit_test::lazy_ostream::inst;
  local_140 = "";
  local_1c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_1c0 = "";
  pvVar1 = (iterator)0x2;
  puVar3 = local_58._M_impl.super__Vector_impl_data._M_start;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_short,unsigned_short>
            (&local_158,&local_1c8,0x176,1,2,local_58._M_impl.super__Vector_impl_data._M_start,
             "req1.indexes[0]",
             req2.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_start,"req2.indexes[0]");
  local_1d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = (iterator)puVar3;
  msg_02.m_begin = pvVar1;
  file_02.m_end = (iterator)0x177;
  file_02.m_begin = (iterator)&local_1d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1e8,
             msg_02);
  local_150 = 0;
  local_158 = &PTR__lazy_ostream_01139f30;
  local_148 = boost::unit_test::lazy_ostream::inst;
  local_140 = "";
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_1f0 = "";
  puVar3 = local_58._M_impl.super__Vector_impl_data._M_start + 1;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_short,unsigned_short>
            (&local_158,&local_1f8,0x177,1,2,puVar3,"req1.indexes[1]",
             req2.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_start + 1,"req2.indexes[1]");
  local_208 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = (iterator)puVar3;
  msg_03.m_begin = pvVar1;
  file_03.m_end = (iterator)0x178;
  file_03.m_begin = (iterator)&local_208;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_218,
             msg_03);
  local_150 = 0;
  local_158 = &PTR__lazy_ostream_01139f30;
  local_148 = boost::unit_test::lazy_ostream::inst;
  local_140 = "";
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_220 = "";
  puVar3 = local_58._M_impl.super__Vector_impl_data._M_start + 2;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_short,unsigned_short>
            (&local_158,&local_228,0x178,1,2,puVar3,"req1.indexes[2]",
             req2.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_start + 2,"req2.indexes[2]");
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_230 = "";
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = (iterator)puVar3;
  msg_04.m_begin = pvVar1;
  file_04.m_end = (iterator)0x179;
  file_04.m_begin = (iterator)&local_238;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_248,
             msg_04);
  local_150 = 0;
  local_158 = &PTR__lazy_ostream_01139f30;
  local_148 = boost::unit_test::lazy_ostream::inst;
  local_140 = "";
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_250 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_short,unsigned_short>
            (&local_158,&local_258,0x179,1,2,local_58._M_impl.super__Vector_impl_data._M_start + 3,
             "req1.indexes[3]",
             req2.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_start + 3,"req2.indexes[3]");
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&req2.indexes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base(&local_118);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(TransactionsRequestSerializationTest) {
    BlockTransactionsRequest req1;
    req1.blockhash = m_rng.rand256();
    req1.indexes.resize(4);
    req1.indexes[0] = 0;
    req1.indexes[1] = 1;
    req1.indexes[2] = 3;
    req1.indexes[3] = 4;

    DataStream stream{};
    stream << req1;

    BlockTransactionsRequest req2;
    stream >> req2;

    BOOST_CHECK_EQUAL(req1.blockhash.ToString(), req2.blockhash.ToString());
    BOOST_CHECK_EQUAL(req1.indexes.size(), req2.indexes.size());
    BOOST_CHECK_EQUAL(req1.indexes[0], req2.indexes[0]);
    BOOST_CHECK_EQUAL(req1.indexes[1], req2.indexes[1]);
    BOOST_CHECK_EQUAL(req1.indexes[2], req2.indexes[2]);
    BOOST_CHECK_EQUAL(req1.indexes[3], req2.indexes[3]);
}